

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int getPageMMap(Pager *pPager,Pgno pgno,DbPage **ppPage,int flags)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  DbPage *__s;
  void *pvVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  u32 iFrame;
  void *pData;
  u32 local_4c;
  void *local_48;
  void *local_40;
  size_t local_38;
  
  local_4c = 0;
  if (pgno < 2) {
    bVar5 = 0;
  }
  else {
    bVar5 = (byte)((flags & 2U) >> 1) | pPager->eState == '\x01';
  }
  if (pgno == 0) {
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xdb6c,
                "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
    return 0xb;
  }
  if (((bVar5 != 0) && (pPager->pWal != (Wal *)0x0)) &&
     (iVar2 = sqlite3WalFindFrame(pPager->pWal,pgno,&local_4c), iVar2 != 0)) {
    *ppPage = (DbPage *)0x0;
    return iVar2;
  }
  if ((bVar5 & local_4c == 0) != 1) goto LAB_0014cb33;
  local_48 = (void *)0x0;
  uVar6 = pgno - 1;
  uVar7 = (ulong)uVar6;
  uVar3 = (*pPager->fd->pMethods->xFetch)
                    (pPager->fd,(long)pPager->pageSize * uVar7,pPager->pageSize,&local_48);
  if ((uVar3 == 0) && (local_48 != (void *)0x0)) {
    if ((pPager->eState < 2) && (pPager->tempFile == '\0')) {
      __s = (DbPage *)0x0;
    }
    else {
      __s = sqlite3PagerLookup(pPager,pgno);
    }
    if (__s == (DbPage *)0x0) {
      __s = pPager->pMmapFreelist;
      if (__s != (DbPage *)0x0) {
        pPager->pMmapFreelist = __s->pDirty;
        __s->pDirty = (PgHdr *)0x0;
        *(undefined8 *)__s->pExtra = 0;
        pvVar4 = local_48;
LAB_0014cb01:
        __s->pgno = pgno;
        __s->pData = pvVar4;
        pPager->nMmapOut = pPager->nMmapOut + 1;
        goto LAB_0014cb12;
      }
      local_40 = local_48;
      local_38 = (ulong)pPager->nExtra + 0x48;
      __s = (DbPage *)sqlite3Malloc(local_38);
      if (__s != (DbPage *)0x0) {
        memset(__s,0,local_38);
        __s->pExtra = __s + 1;
        __s->flags = 0x20;
        __s->nRef = 1;
        __s->pPager = pPager;
        pvVar4 = local_40;
        goto LAB_0014cb01;
      }
      (*pPager->fd->pMethods->xUnfetch)(pPager->fd,(long)pPager->pageSize * uVar7,local_40);
      uVar3 = 7;
    }
    else {
      (*pPager->fd->pMethods->xUnfetch)(pPager->fd,(long)pPager->pageSize * uVar7,local_48);
LAB_0014cb12:
      uVar3 = 0;
    }
    uVar6 = 0;
    if (__s == (DbPage *)0x0) goto LAB_0014cb1c;
LAB_0014cb26:
    *ppPage = __s;
    bVar1 = false;
  }
  else {
LAB_0014cb1c:
    if (uVar3 != 0) {
      __s = (DbPage *)0x0;
      uVar6 = uVar3;
      goto LAB_0014cb26;
    }
    bVar1 = true;
  }
  if (!bVar1) {
    return uVar6;
  }
LAB_0014cb33:
  iVar2 = getPageNormal(pPager,pgno,ppPage,flags);
  return iVar2;
}

Assistant:

static int getPageMMap(
  Pager *pPager,      /* The pager open on the database file */
  Pgno pgno,          /* Page number to fetch */
  DbPage **ppPage,    /* Write a pointer to the page here */
  int flags           /* PAGER_GET_XXX flags */
){
  int rc = SQLITE_OK;
  PgHdr *pPg = 0;
  u32 iFrame = 0;                 /* Frame to read from WAL file */

  /* It is acceptable to use a read-only (mmap) page for any page except
  ** page 1 if there is no write-transaction open or the ACQUIRE_READONLY
  ** flag was specified by the caller. And so long as the db is not a 
  ** temporary or in-memory database.  */
  const int bMmapOk = (pgno>1
   && (pPager->eState==PAGER_READER || (flags & PAGER_GET_READONLY))
  );

  assert( USEFETCH(pPager) );
#ifdef SQLITE_HAS_CODEC
  assert( pPager->xCodec==0 );
#endif

  /* Optimization note:  Adding the "pgno<=1" term before "pgno==0" here
  ** allows the compiler optimizer to reuse the results of the "pgno>1"
  ** test in the previous statement, and avoid testing pgno==0 in the
  ** common case where pgno is large. */
  if( pgno<=1 && pgno==0 ){
    return SQLITE_CORRUPT_BKPT;
  }
  assert( pPager->eState>=PAGER_READER );
  assert( assert_pager_state(pPager) );
  assert( pPager->hasHeldSharedLock==1 );
  assert( pPager->errCode==SQLITE_OK );

  if( bMmapOk && pagerUseWal(pPager) ){
    rc = sqlite3WalFindFrame(pPager->pWal, pgno, &iFrame);
    if( rc!=SQLITE_OK ){
      *ppPage = 0;
      return rc;
    }
  }
  if( bMmapOk && iFrame==0 ){
    void *pData = 0;
    rc = sqlite3OsFetch(pPager->fd, 
        (i64)(pgno-1) * pPager->pageSize, pPager->pageSize, &pData
    );
    if( rc==SQLITE_OK && pData ){
      if( pPager->eState>PAGER_READER || pPager->tempFile ){
        pPg = sqlite3PagerLookup(pPager, pgno);
      }
      if( pPg==0 ){
        rc = pagerAcquireMapPage(pPager, pgno, pData, &pPg);
      }else{
        sqlite3OsUnfetch(pPager->fd, (i64)(pgno-1)*pPager->pageSize, pData);
      }
      if( pPg ){
        assert( rc==SQLITE_OK );
        *ppPage = pPg;
        return SQLITE_OK;
      }
    }
    if( rc!=SQLITE_OK ){
      *ppPage = 0;
      return rc;
    }
  }
  return getPageNormal(pPager, pgno, ppPage, flags);
}